

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O2

void * tinfl_decompress_mem_to_heap(void *pSrc_buf,size_t src_buf_len,size_t *pOut_len,int flags)

{
  tinfl_status tVar1;
  size_t sVar2;
  mz_uint8 *pmVar3;
  mz_uint8 *pOut_buf_start;
  ulong size;
  long lVar4;
  size_t dst_buf_size;
  size_t src_buf_size;
  size_t local_2b30;
  tinfl_decompressor decomp;
  
  *pOut_len = 0;
  decomp.m_state = 0;
  sVar2 = 0;
  lVar4 = 0;
  size = 0;
  pOut_buf_start = (mz_uint8 *)0x0;
  local_2b30 = src_buf_len;
  while( true ) {
    src_buf_size = local_2b30 - lVar4;
    dst_buf_size = size - sVar2;
    pmVar3 = pOut_buf_start + sVar2;
    if (pOut_buf_start == (mz_uint8 *)0x0) {
      pmVar3 = (mz_uint8 *)0x0;
    }
    tVar1 = tinfl_decompress(&decomp,(mz_uint8 *)((long)pSrc_buf + lVar4),&src_buf_size,
                             pOut_buf_start,pmVar3,&dst_buf_size,flags & 0xfffffff9U | 4);
    if ((tVar1 < TINFL_STATUS_DONE) || (tVar1 == TINFL_STATUS_NEEDS_MORE_INPUT)) break;
    lVar4 = lVar4 + src_buf_size;
    *pOut_len = *pOut_len + dst_buf_size;
    if (tVar1 == TINFL_STATUS_DONE) {
      return pOut_buf_start;
    }
    size = size * 2;
    if (size < 0x81) {
      size = 0x80;
    }
    pmVar3 = (mz_uint8 *)crnlib::crnlib_realloc(pOut_buf_start,size,(size_t *)0x0,true);
    if (pmVar3 == (mz_uint8 *)0x0) break;
    sVar2 = *pOut_len;
    pOut_buf_start = pmVar3;
  }
  crnlib::crnlib_free(pOut_buf_start);
  *pOut_len = 0;
  return (void *)0x0;
}

Assistant:

void* tinfl_decompress_mem_to_heap(const void* pSrc_buf, size_t src_buf_len, size_t* pOut_len, int flags) {
  tinfl_decompressor decomp;
  void *pBuf = NULL, *pNew_buf;
  size_t src_buf_ofs = 0, out_buf_capacity = 0;
  *pOut_len = 0;
  tinfl_init(&decomp);
  for (;;) {
    size_t src_buf_size = src_buf_len - src_buf_ofs, dst_buf_size = out_buf_capacity - *pOut_len, new_out_buf_capacity;
    tinfl_status status = tinfl_decompress(&decomp, (const mz_uint8*)pSrc_buf + src_buf_ofs, &src_buf_size, (mz_uint8*)pBuf, pBuf ? (mz_uint8*)pBuf + *pOut_len : NULL, &dst_buf_size,
                                           (flags & ~TINFL_FLAG_HAS_MORE_INPUT) | TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF);
    if ((status < 0) || (status == TINFL_STATUS_NEEDS_MORE_INPUT)) {
      MZ_FREE(pBuf);
      *pOut_len = 0;
      return NULL;
    }
    src_buf_ofs += src_buf_size;
    *pOut_len += dst_buf_size;
    if (status == TINFL_STATUS_DONE)
      break;
    new_out_buf_capacity = out_buf_capacity * 2;
    if (new_out_buf_capacity < 128)
      new_out_buf_capacity = 128;
    pNew_buf = MZ_REALLOC(pBuf, new_out_buf_capacity);
    if (!pNew_buf) {
      MZ_FREE(pBuf);
      *pOut_len = 0;
      return NULL;
    }
    pBuf = pNew_buf;
    out_buf_capacity = new_out_buf_capacity;
  }
  return pBuf;
}